

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

bool compareFile(string *a,string *b)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  undefined1 auStack_20050 [8];
  array<unsigned_char,_65536UL> temp0;
  array<unsigned_char,_65536UL> temp1;
  File fp0;
  File fp1;
  
  File::File((File *)(temp1._M_elems + 0xfff8),a,READ);
  File::File((File *)&fp0.fp_,b,READ);
  do {
    sVar2 = File::Read<unsigned_char,65536ul>
                      ((File *)(temp1._M_elems + 0xfff8),
                       (array<unsigned_char,_65536UL> *)auStack_20050);
    sVar3 = File::Read<unsigned_char,65536ul>
                      ((File *)&fp0.fp_,(array<unsigned_char,_65536UL> *)(temp0._M_elems + 0xfff8));
    iVar5 = (int)sVar2;
    if (iVar5 != (int)sVar3) {
LAB_0016aab1:
      bVar4 = false;
      goto LAB_0016aab3;
    }
    iVar1 = bcmp((array<unsigned_char,_65536UL> *)auStack_20050,temp0._M_elems + 0xfff8,(long)iVar5)
    ;
    if (iVar1 != 0) goto LAB_0016aab1;
  } while (0 < iVar5);
  bVar4 = true;
LAB_0016aab3:
  File::~File((File *)&fp0.fp_);
  File::~File((File *)(temp1._M_elems + 0xfff8));
  return bVar4;
}

Assistant:

bool compareFile(const std::string& a, const std::string& b)
{
    std::array<uint8_t, 65536> temp0;
    std::array<uint8_t, 65536> temp1;
    File fp0 = File{a};
    File fp1 = File{b};
    while (true) {
        int rc0 = fp0.Read(temp0);
        int rc1 = fp1.Read(temp1);
        if (rc0 != rc1)
            return false;
        if (memcmp(&temp0[0], &temp1[0], rc0) != 0)
            return false;
        if (rc0 <= 0)
            break;
    }
    return true;
}